

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  long lVar1;
  StreamingListener *this_00;
  string local_60;
  string local_40;
  
  if (_DAT_00186750 != 0) {
    lVar1 = std::__cxx11::string::find('H',0x3a);
    if (lVar1 == -1) {
      printf("WARNING: unrecognized streaming target \"%s\" ignored.\n",
             FLAGS_gtest_stream_result_to_abi_cxx11_);
      fflush(_stdout);
      return;
    }
    this_00 = (StreamingListener *)operator_new(0x10);
    std::__cxx11::string::substr((ulong)&local_60,0x186748);
    std::__cxx11::string::substr((ulong)&local_40,0x186748);
    StreamingListener::StreamingListener(this_00,&local_60,&local_40);
    TestEventListeners::Append(&this->listeners_,(TestEventListener *)this_00);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

void UnitTestImpl::ConfigureStreamingOutput() {
  const std::string& target = GTEST_FLAG(stream_result_to);
  if (!target.empty()) {
    const size_t pos = target.find(':');
    if (pos != std::string::npos) {
      listeners()->Append(new StreamingListener(target.substr(0, pos),
                                                target.substr(pos+1)));
    } else {
      printf("WARNING: unrecognized streaming target \"%s\" ignored.\n",
             target.c_str());
      fflush(stdout);
    }
  }
}